

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  int iVar1;
  int extraout_EAX;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = ctxt->spaceMax;
  if (iVar1 <= ctxt->spaceNr) {
    if (iVar1 < 1) {
      uVar4 = 10;
    }
    else {
      uVar4 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        uVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          uVar4 = 1000000000;
        }
      }
    }
    if (((int)uVar4 < 0) ||
       (piVar2 = (int *)(*xmlRealloc)(ctxt->spaceTab,(ulong)uVar4 << 2), piVar2 == (int *)0x0)) {
      xmlCtxtErrMemory(ctxt);
      return extraout_EAX;
    }
    ctxt->spaceTab = piVar2;
    ctxt->spaceMax = uVar4;
  }
  piVar2 = ctxt->spaceTab;
  piVar2[ctxt->spaceNr] = val;
  ctxt->space = piVar2 + ctxt->spaceNr;
  iVar1 = ctxt->spaceNr + 1;
  ctxt->spaceNr = iVar1;
  return iVar1;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->spaceMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlErrMemory(ctxt);
	    return(-1);
        }

        tmp = xmlRealloc(ctxt->spaceTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt);
	    return(-1);
	}
	ctxt->spaceTab = tmp;

        ctxt->spaceMax = newSize;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}